

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall
TadsHttpReplyResult::TadsHttpReplyResult
          (TadsHttpReplyResult *this,TadsHttpRequest *req,vm_globalvar_t *reqvar,bodyArg *body,
          int sock_err,char *msg)

{
  OS_Event *pOVar1;
  TadsMessage *in_RCX;
  char *in_RDX;
  __int_type in_RSI;
  TadsEventMessage *in_RDI;
  undefined4 in_R8D;
  OS_Event *in_stack_ffffffffffffffa8;
  
  TadsEventMessage::TadsEventMessage(in_RDI,in_stack_ffffffffffffffa8);
  (in_RDI->super_TadsMessage).super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpReplyResult_0042bd98;
  in_RDI[1].super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj = (_func_int **)0x0;
  in_RDI[1].super_TadsMessage.super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i = in_RSI;
  in_RDI[1].super_TadsMessage.typ = in_RDX;
  in_RDI[1].super_TadsMessage.nxt = in_RCX;
  *(undefined4 *)&in_RDI[1].super_TadsMessage.ev = in_R8D;
  pOVar1 = (OS_Event *)lib_copy_str((char *)in_RDI);
  in_RDI[1].super_TadsMessage.quit_evt = pOVar1;
  return;
}

Assistant:

TadsHttpReplyResult(VMG_ TadsHttpRequest *req, vm_globalvar_t *reqvar,
                        bodyArg *body, int sock_err, const char *msg)
        : TadsEventMessage(0)
    {
        /* save the VM globals for use in the main thread */
        this->vmg = VMGLOB_ADDR;

        /* remember our parameters */
        this->req = req;
        this->reqvar = reqvar;
        this->body = body;
        this->sock_err = sock_err;
        this->msg = lib_copy_str(msg);
    }